

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtmpfil.cpp
# Opt level: O0

vm_tmpfil_ext * vm_tmpfil_ext::alloc_ext(CVmObjTemporaryFile *self,char *fname)

{
  int iVar1;
  size_t sVar2;
  CVmVarHeap *pCVar3;
  undefined4 extraout_var;
  char *in_RSI;
  undefined8 in_RDI;
  vm_tmpfil_ext *ext;
  size_t siz;
  
  sVar2 = strlen(in_RSI);
  pCVar3 = CVmMemory::get_var_heap(G_mem_X);
  iVar1 = (*pCVar3->_vptr_CVmVarHeap[4])(pCVar3,sVar2 + 1,in_RDI);
  strcpy((char *)CONCAT44(extraout_var,iVar1),in_RSI);
  return (vm_tmpfil_ext *)CONCAT44(extraout_var,iVar1);
}

Assistant:

vm_tmpfil_ext *vm_tmpfil_ext::alloc_ext(VMG_ CVmObjTemporaryFile *self,
                                        const char *fname)
{
    /* calculate how much space we need */
    size_t siz = sizeof(vm_tmpfil_ext) + strlen(fname);

    /* allocate the memory */
    vm_tmpfil_ext *ext = (vm_tmpfil_ext *)G_mem->get_var_heap()->alloc_mem(
        siz, self);

    /* copy the filename */
    strcpy(ext->filename, fname);

    /* return the new extension */
    return ext;
}